

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O3

object * primitive(int primitiveNumber,object *args,int *failed)

{
  uchar *to;
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  __int32_t **pp_Var7;
  void *pvVar8;
  uintptr_t uVar9;
  uint *puVar10;
  FILE *pFVar11;
  object *poVar12;
  object *poVar13;
  size_t sVar14;
  object **ppoVar15;
  ssize_t sVar16;
  int *piVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  FILE **ppFVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  char *pcVar29;
  char *pcVar30;
  char *pcVar31;
  char *pcVar32;
  char *pcVar33;
  char *pcVar34;
  char *pcVar35;
  int iVar36;
  ushort uVar37;
  ulong uVar38;
  long lVar39;
  char acStack_70 [8];
  undefined1 local_68 [8];
  sockaddr_in sin;
  char netBuffer [18];
  in_addr iaddr;
  
  poVar13 = nilObject;
  *failed = 0;
  iVar6 = prog_argc;
  if (0x95 < primitiveNumber) {
    switch(primitiveNumber) {
    case 0x96:
      poVar12 = (object *)args[1].header;
      uVar20 = poVar12->header;
      if ((uVar20 & 2) == 0) {
        pcVar23 = "#position: failed, first arg is not a binary object.";
      }
      else {
        uVar38 = (args[1].class)->header;
        if ((uVar38 & 2) != 0) {
          uVar5 = (uint)uVar20;
          if (uVar5 < 4) {
            return poVar13;
          }
          uVar3 = (uint)uVar38;
          if (uVar3 < 4) {
            return poVar13;
          }
          uVar5 = uVar5 >> 2;
          uVar3 = uVar3 >> 2;
          if (uVar5 < uVar3) {
            return poVar13;
          }
          pcVar24 = local_68 + -(ulong)(uVar5 + 0x10 & 0xfffffff0);
          pcVar23 = pcVar24 + -(ulong)(uVar3 + 0x10 & 0xfffffff0);
          pcVar23[-8] = -0xc;
          pcVar23[-7] = -0x4c;
          pcVar23[-6] = '\x10';
          pcVar23[-5] = '\0';
          pcVar23[-4] = '\0';
          pcVar23[-3] = '\0';
          pcVar23[-2] = '\0';
          pcVar23[-1] = '\0';
          getUnixString(pcVar24,uVar5 + 1,poVar12);
          poVar13 = args[1].class;
          pcVar23[-8] = '\x03';
          pcVar23[-7] = -0x4b;
          pcVar23[-6] = '\x10';
          pcVar23[-5] = '\0';
          pcVar23[-4] = '\0';
          pcVar23[-3] = '\0';
          pcVar23[-2] = '\0';
          pcVar23[-1] = '\0';
          getUnixString(pcVar23,uVar3 + 1,poVar13);
          pcVar23[-8] = '\x0e';
          pcVar23[-7] = -0x4b;
          pcVar23[-6] = '\x10';
          pcVar23[-5] = '\0';
          pcVar23[-4] = '\0';
          pcVar23[-3] = '\0';
          pcVar23[-2] = '\0';
          pcVar23[-1] = '\0';
          pcVar23 = strstr(pcVar24,pcVar23);
          if (pcVar23 == (char *)0x0) {
            return nilObject;
          }
          return (object *)(((long)pcVar23 - (long)pcVar24) * 2 + 3);
        }
        pcVar23 = "#position: failed, second arg is not a binary object.";
      }
      acStack_70[0] = -0x48;
      acStack_70[1] = -0x4d;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      puts(pcVar23);
      goto LAB_0010b3b8;
    case 0x97:
      poVar13 = (object *)args[1].header;
      uVar5 = (uint)poVar13->header;
      uVar3 = uVar5 >> 2;
      iVar6 = 0;
      stack0xffffffffffffffc0 = (object *)CONCAT44(iaddr.s_addr,uVar5);
      if (3 < uVar5) {
        uVar20 = 0;
        iVar6 = 0;
        do {
          acStack_70[0] = -0x15;
          acStack_70[1] = -0x55;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          pvVar8 = memchr(";/?:@&=+!*\'(),$-_.<>#%\"\t\n\r",
                          (int)*(char *)((long)&poVar13[1].header + uVar20),0x1b);
          iVar6 = (iVar6 + 1) - (uint)(pvVar8 == (void *)0x0);
          uVar20 = uVar20 + 1;
        } while (uVar3 + (uVar3 == 0) != uVar20);
        iVar6 = iVar6 * 2;
      }
      lVar19 = (long)rootTop;
      rootTop = rootTop + 1;
      rootStack[lVar19] = poVar13;
      iVar6 = iVar6 + uVar3;
      acStack_70[0] = '(';
      acStack_70[1] = -0x54;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      poVar13 = gcialloc(iVar6);
      poVar13->class = StringClass;
      lVar19 = (long)rootTop;
      rootTop = rootTop + -1;
      if ((3 < stack0xffffffffffffffc0) && (iVar6 != 0)) {
        register0x00000008 = (object *)(ulong)uVar3;
        poVar12 = (&oldTop)[lVar19];
        iVar4 = 0;
        lVar19 = 0x10;
        do {
          cVar2 = *(char *)((long)&poVar12->header + lVar19);
          acStack_70[0] = -0x7a;
          acStack_70[1] = -0x54;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          pvVar8 = memchr(";/?:@&=+!*\'(),$-_.<>#%\"\t\n\r",(int)cVar2,0x1b);
          lVar21 = (long)iVar4;
          if (pvVar8 == (void *)0x0) {
            if (cVar2 == ' ') {
              cVar2 = '+';
            }
            iVar4 = iVar4 + 1;
            *(char *)((long)&poVar13[1].header + lVar21) = cVar2;
          }
          else {
            *(undefined1 *)((long)&poVar13[1].header + lVar21) = 0x25;
            *(char *)((long)&poVar13[1].header + lVar21 + 1) =
                 "0123456789ABCDEF"[*(byte *)((long)&poVar12->header + lVar19) >> 4];
            iVar4 = iVar4 + 3;
            *(char *)((long)&poVar13[1].header + lVar21 + 2) =
                 "0123456789ABCDEF"[*(byte *)((long)&poVar12->header + lVar19) & 0xf];
          }
        } while ((lVar19 - 0xfU < stack0xffffffffffffffc0) && (lVar19 = lVar19 + 1, iVar4 < iVar6));
      }
      break;
    case 0x98:
      poVar13 = (object *)args[1].header;
      uVar5 = (uint)poVar13->header;
      uVar3 = uVar5 >> 2;
      iVar6 = 0;
      if (3 < uVar5) {
        uVar20 = 0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + (uint)(*(char *)((long)&poVar13[1].header + uVar20) == '%');
          uVar20 = uVar20 + 1;
        } while (uVar3 + (uVar3 == 0) != uVar20);
        iVar6 = iVar6 * 2;
      }
      lVar19 = (long)rootTop;
      rootTop = rootTop + 1;
      rootStack[lVar19] = poVar13;
      iVar6 = uVar3 - iVar6;
      iVar4 = 0;
      if (0 < iVar6) {
        iVar4 = iVar6;
      }
      stack0xffffffffffffffc0 = (object *)CONCAT44(iaddr.s_addr,iVar4);
      acStack_70[0] = -0x67;
      acStack_70[1] = -0x53;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      poVar13 = gcialloc(iVar4);
      poVar13->class = StringClass;
      lVar19 = (long)rootTop;
      rootTop = rootTop + -1;
      if ((3 < uVar5) && (0 < iVar6)) {
        poVar12 = (&oldTop)[lVar19];
        iVar36 = 0;
        lVar19 = 0x10;
        iVar4 = 0;
        iVar6 = stack0xffffffffffffffc0;
        do {
          cVar2 = *(char *)((long)&poVar12->header + lVar19);
          if (cVar2 == '+') {
            cVar2 = ' ';
          }
          iVar18 = iVar4;
          if (cVar2 == '%') {
            iVar18 = 3;
          }
          if (iVar18 == 1) {
            acStack_70[0] = '^';
            acStack_70[1] = -0x52;
            acStack_70[2] = '\x10';
            acStack_70[3] = '\0';
            acStack_70[4] = '\0';
            acStack_70[5] = '\0';
            acStack_70[6] = '\0';
            acStack_70[7] = '\0';
            pp_Var7 = __ctype_toupper_loc();
            acStack_70[0] = '|';
            acStack_70[1] = -0x52;
            acStack_70[2] = '\x10';
            acStack_70[3] = '\0';
            acStack_70[4] = '\0';
            acStack_70[5] = '\0';
            acStack_70[6] = '\0';
            acStack_70[7] = '\0';
            pvVar8 = memchr("0123456789ABCDEF",(*pp_Var7)[cVar2],0x11);
            iVar6 = (int)pvVar8 + -0x10e35b;
            if (iVar6 < 0) {
LAB_0010b527:
              ppoVar15 = &nilObject;
              goto LAB_0010b712;
            }
            pcVar23 = (char *)((long)&poVar13[1].header + (long)iVar36);
            *pcVar23 = *pcVar23 + (char)iVar6;
            iVar36 = iVar36 + 1;
            iVar4 = 0;
LAB_0010ae95:
            iVar6 = stack0xffffffffffffffc0;
          }
          else if (iVar18 == 3) {
            iVar4 = 2;
          }
          else {
            if (iVar18 == 2) {
              acStack_70[0] = '\x17';
              acStack_70[1] = -0x52;
              acStack_70[2] = '\x10';
              acStack_70[3] = '\0';
              acStack_70[4] = '\0';
              acStack_70[5] = '\0';
              acStack_70[6] = '\0';
              acStack_70[7] = '\0';
              pp_Var7 = __ctype_toupper_loc();
              acStack_70[0] = '5';
              acStack_70[1] = -0x52;
              acStack_70[2] = '\x10';
              acStack_70[3] = '\0';
              acStack_70[4] = '\0';
              acStack_70[5] = '\0';
              acStack_70[6] = '\0';
              acStack_70[7] = '\0';
              pvVar8 = memchr("0123456789ABCDEF",(*pp_Var7)[cVar2],0x11);
              iVar6 = (int)pvVar8 + -0x10e35b;
              if (iVar6 < 0) goto LAB_0010b527;
              *(char *)((long)&poVar13[1].header + (long)iVar36) = (char)iVar6 << 4;
              iVar4 = 1;
              goto LAB_0010ae95;
            }
            lVar21 = (long)iVar36;
            iVar36 = iVar36 + 1;
            *(char *)((long)&poVar13[1].header + lVar21) = cVar2;
          }
        } while ((lVar19 - 0xfU < (ulong)uVar3) && (lVar19 = lVar19 + 1, iVar36 < iVar6));
      }
      break;
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
switchD_0010a9d0_default:
      pcVar23 = "unknown primitive %d!";
      iVar6 = 0x247;
LAB_0010ab99:
      acStack_70[0] = -0x60;
      acStack_70[1] = -0x55;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      error_impl("primitive",iVar6,pcVar23);
      break;
    case 0xa0:
      acStack_70[0] = '\x16';
      acStack_70[1] = -0x53;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      printf("Log: %.*s\n",(ulong)(*(uint *)args[1].header >> 2),(uint *)args[1].header + 4);
      *failed = 0;
      poVar13 = nilObject;
      break;
    case 0xa1:
      builtin_strncpy(acStack_70,"خ\x10",4);
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      uVar9 = time_usec();
      acStack_70[0] = -0x1b;
      acStack_70[1] = -0x52;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      poVar13 = gcialloc(8);
      poVar13->class = IntegerClass;
      poVar13[1].header = uVar9;
      iVar4 = rootTop;
LAB_0010b493:
      rootTop = iVar4;
      *failed = 0;
      break;
    default:
      if (primitiveNumber == 0xaa) {
        poVar13 = (object *)((long)&memoryPointer->header + (long)(prog_argc * -8 + -0x10));
        memoryPointer = poVar13;
        if ((long)poVar13 < (long)memoryBase) {
          acStack_70[0] = -0x6c;
          acStack_70[1] = -0x4d;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          poVar13 = gcollect(prog_argc);
          iVar6 = prog_argc;
        }
        else {
          poVar13->header = (ulong)(uint)(prog_argc * 4);
        }
        poVar13->class = ArrayClass;
        iVar4 = rootTop;
        lVar19 = (long)rootTop;
        rootTop = rootTop + 1;
        rootStack[lVar19] = poVar13;
        if (0 < iVar6) {
          lVar19 = 0;
          do {
            pcVar23 = prog_argv[lVar19];
            acStack_70[0] = '!';
            acStack_70[1] = -0x4c;
            acStack_70[2] = '\x10';
            acStack_70[3] = '\0';
            acStack_70[4] = '\0';
            acStack_70[5] = '\0';
            acStack_70[6] = '\0';
            acStack_70[7] = '\0';
            sVar14 = strlen(pcVar23);
            uVar5 = (uint)sVar14;
            acStack_70[0] = ',';
            acStack_70[1] = -0x4c;
            acStack_70[2] = '\x10';
            acStack_70[3] = '\0';
            acStack_70[4] = '\0';
            acStack_70[5] = '\0';
            acStack_70[6] = '\0';
            acStack_70[7] = '\0';
            poVar13 = gcialloc(uVar5);
            poVar13->class = StringClass;
            if (0 < (int)uVar5) {
              uVar20 = 0;
              do {
                *(char *)((long)&poVar13[1].header + uVar20) = pcVar23[uVar20];
                uVar20 = uVar20 + 1;
              } while ((uVar5 & 0x7fffffff) != uVar20);
            }
            iVar6 = rootTop;
            lVar21 = (long)rootTop;
            (&(&oldTop)[lVar21][1].header)[lVar19] = (uintptr_t)poVar13;
            lVar19 = lVar19 + 1;
          } while (lVar19 < prog_argc);
          poVar13 = (&oldTop)[lVar21];
          iVar4 = iVar6 + -1;
        }
        goto LAB_0010b493;
      }
      if (primitiveNumber != 200) goto switchD_0010a9d0_default;
      switch(args[1].header >> 1 & 0xffffffff) {
      case 0:
        acStack_70[0] = -2;
        acStack_70[1] = -0x56;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        uVar5 = socket(2,1,0);
        if (uVar5 == 0xffffffff) {
          acStack_70[0] = '\x1f';
          acStack_70[1] = -0x55;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          error_impl("primitive",0x1be,"Cannot open TCP socket.");
        }
        sin.sin_zero[0] = '\x01';
        sin.sin_zero[1] = '\0';
        sin.sin_zero[2] = '\0';
        sin.sin_zero[3] = '\0';
        acStack_70[0] = '@';
        acStack_70[1] = -0x55;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        iVar6 = setsockopt(uVar5,1,2,sin.sin_zero,4);
        if (iVar6 != 0) {
          acStack_70[0] = 'K';
          acStack_70[1] = -0x55;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          close(uVar5);
          acStack_70[0] = 'e';
          acStack_70[1] = -0x55;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          error_impl("primitive",0x1c5,"Error setting socket reuse option!");
        }
        acStack_70[0] = -0x7f;
        acStack_70[1] = -0x55;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        info_impl("primitive",0x1ca,"opened socket %d.",(ulong)uVar5);
        break;
      case 1:
        iVar4 = (int)((ulong)args[1].class >> 1);
        acStack_70[0] = -0x43;
        acStack_70[1] = -0x4b;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        iVar6 = listen(iVar4,10);
        if (iVar6 == -1) {
          builtin_strncpy(acStack_70,"ܵ\x10",4);
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          error_impl("primitive",0x1d4,"Error listening on TCP socket.");
        }
        local_68._0_4_ = 0x10;
        acStack_70[0] = -0xf;
        acStack_70[1] = -0x4b;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        uVar5 = accept(iVar4,(sockaddr *)sin.sin_zero,(socklen_t *)local_68);
        if (uVar5 == 0xffffffff) {
          acStack_70[0] = -3;
          acStack_70[1] = -0x4b;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          puVar10 = (uint *)__errno_location();
          acStack_70[0] = '\x19';
          acStack_70[1] = -0x4a;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          error_impl("primitive",0x1de,"Error accepting on TCP socket.  Errno=%d",(ulong)*puVar10);
        }
        break;
      case 2:
        uVar20 = (ulong)args[1].class >> 1;
        acStack_70[0] = 'V';
        acStack_70[1] = -0x4b;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        info_impl("primitive",0x1e8,"closing socket %d.",uVar20 & 0xffffffff);
        acStack_70[0] = ']';
        acStack_70[1] = -0x4b;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        close((int)uVar20);
        goto LAB_0010b70b;
      case 3:
        uVar20 = (ulong)args[1].class >> 1;
        to = sin.sin_zero;
        acStack_70[0] = 'E';
        acStack_70[1] = -0x4a;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        getUnixString((char *)to,0x11,(object *)args[2].header);
        uVar38 = (ulong)args[2].class >> 1;
        acStack_70[0] = 'k';
        acStack_70[1] = -0x4a;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        info_impl("primitive",0x1f8,"Socket: %d",uVar20 & 0xffffffff);
        acStack_70[0] = -0x7c;
        acStack_70[1] = -0x4a;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        info_impl("primitive",0x1f9,"IP: %s",to);
        acStack_70[0] = -99;
        acStack_70[1] = -0x4a;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        info_impl("primitive",0x1fa,"Port: %d",uVar38 & 0xffffffff);
        acStack_70[0] = -0x57;
        acStack_70[1] = -0x4a;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        iVar6 = inet_aton((char *)to,(in_addr *)(netBuffer + 0xc));
        if (iVar6 == 0) {
          builtin_strncpy(acStack_70,"Ƕ\x10",4);
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          error_impl("primitive",0x1fe,"Illegal address passed to bind primitive.");
        }
        uVar37 = (ushort)uVar38;
        local_68._2_2_ = uVar37 << 8 | uVar37 >> 8;
        local_68._0_2_ = 2;
        local_68[4] = netBuffer[0xc];
        local_68[5] = netBuffer[0xd];
        local_68[6] = netBuffer[0xe];
        local_68[7] = netBuffer[0xf];
        acStack_70[0] = -0x14;
        acStack_70[1] = -0x4a;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        iVar6 = bind((int)uVar20,(sockaddr *)local_68,0x10);
        if (iVar6 == -1) {
          acStack_70[0] = '\v';
          acStack_70[1] = -0x49;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          error_impl("primitive",0x208,"Cannot bind TCP socket to address.");
        }
LAB_0010b70b:
        ppoVar15 = &trueObject;
LAB_0010b712:
        return *ppoVar15;
      default:
        pcVar23 = "Unknown socket primitive operation: %d!";
        iVar6 = 0x240;
        goto LAB_0010ab99;
      case 7:
        poVar12 = args[1].class;
        acStack_70[0] = '7';
        acStack_70[1] = -0x49;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        memset(socketReadBuffer,0,0x400);
        acStack_70[0] = 'G';
        acStack_70[1] = -0x49;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        uVar20 = read((int)((ulong)poVar12 >> 1),socketReadBuffer,0x400);
        uVar5 = (uint)uVar20;
        if ((int)uVar5 < 0) {
          acStack_70[0] = 'T';
          acStack_70[1] = -0x49;
          acStack_70[2] = '\x10';
          acStack_70[3] = '\0';
          acStack_70[4] = '\0';
          acStack_70[5] = '\0';
          acStack_70[6] = '\0';
          acStack_70[7] = '\0';
          piVar17 = __errno_location();
          if (*piVar17 != 0xb) {
            acStack_70[0] = -0x45;
            acStack_70[1] = -0x49;
            acStack_70[2] = '\x10';
            acStack_70[3] = '\0';
            acStack_70[4] = '\0';
            acStack_70[5] = '\0';
            acStack_70[6] = '\0';
            acStack_70[7] = '\0';
            info_impl("primitive",0x218,"socket read returned an error: %d (%d)!",
                      uVar20 & 0xffffffff);
            goto LAB_0010b3b8;
          }
        }
        acStack_70[0] = 'e';
        acStack_70[1] = -0x49;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        poVar13 = gcialloc(uVar5);
        poVar13->class = ByteArrayClass;
        if ((int)uVar5 < 1) {
          return poVar13;
        }
        uVar20 = 0;
        do {
          *(uint8_t *)((long)&poVar13[1].header + uVar20) = socketReadBuffer[uVar20];
          uVar20 = uVar20 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar20);
        return poVar13;
      case 8:
        acStack_70[0] = '{';
        acStack_70[1] = -0x4b;
        acStack_70[2] = '\x10';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        sVar16 = write((int)((ulong)args[1].class >> 1),(uint *)args[2].header + 4,
                       (ulong)(*(uint *)args[2].header >> 2));
        if ((int)sVar16 < 1) {
          return nilObject;
        }
        return (object *)((ulong)(uint)((int)sVar16 * 2) + 1);
      }
LAB_0010b61c:
      poVar13 = (object *)((long)(int)uVar5 * 2 + 1);
    }
    return poVar13;
  }
  switch(primitiveNumber) {
  case 100:
    poVar12 = (object *)args[1].header;
    uVar5 = (uint)poVar12->header >> 2;
    pcVar23 = local_68 + -(ulong)(uVar5 + 0x10 & 0xfffffff0);
    uVar3 = (uint)(args[1].class)->header >> 2;
    pcVar24 = pcVar23 + -(ulong)(uVar3 + 0x10 & 0xfffffff0);
    pcVar24[-8] = '\x13';
    pcVar24[-7] = -0x56;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    getUnixString(pcVar23,uVar5 + 1,poVar12);
    poVar12 = args[1].class;
    pcVar24[-8] = '\"';
    pcVar24[-7] = -0x56;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    getUnixString(pcVar24,uVar3 + 1,poVar12);
    pcVar24[-8] = '-';
    pcVar24[-7] = -0x56;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    pFVar11 = fopen(pcVar23,pcVar24);
    if (pFVar11 != (FILE *)0x0) {
      ppFVar22 = filePointers;
      poVar12 = (object *)0x1;
      do {
        if (*ppFVar22 == (FILE *)0x0) {
          *ppFVar22 = (FILE *)pFVar11;
          return poVar12;
        }
        ppFVar22 = ppFVar22 + 1;
        poVar12 = (object *)((long)&poVar12->header + 2);
      } while (poVar12 != (object *)0x191);
      pcVar24[-8] = 'w';
      pcVar24[-7] = -0x56;
      pcVar24[-6] = '\x10';
      pcVar24[-5] = '\0';
      pcVar24[-4] = '\0';
      pcVar24[-3] = '\0';
      pcVar24[-2] = '\0';
      pcVar24[-1] = '\0';
      error_impl("primitive",0x61,"too many open files");
      return poVar13;
    }
    break;
  case 0x65:
    uVar20 = args[1].header >> 1;
    if ((199 < (uint)uVar20) || ((FILE *)filePointers[uVar20 & 0xff] == (FILE *)0x0)) break;
    acStack_70[0] = '0';
    acStack_70[1] = -0x50;
    acStack_70[2] = '\x10';
    acStack_70[3] = '\0';
    acStack_70[4] = '\0';
    acStack_70[5] = '\0';
    acStack_70[6] = '\0';
    acStack_70[7] = '\0';
    uVar5 = fgetc((FILE *)filePointers[uVar20 & 0xff]);
    if (uVar5 == 0xffffffff) {
      return poVar13;
    }
    goto LAB_0010b61c;
  case 0x66:
    uVar20 = args[1].header >> 1;
    if (((uint)uVar20 < 200) && ((FILE *)filePointers[uVar20 & 0xff] != (FILE *)0x0)) {
      acStack_70[0] = 'g';
      acStack_70[1] = -0x51;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      fputc((int)((ulong)args[1].class >> 1),(FILE *)filePointers[uVar20 & 0xff]);
      return poVar13;
    }
    break;
  case 0x67:
    uVar20 = args[1].header >> 1;
    if (((uint)uVar20 < 200) && ((FILE *)filePointers[uVar20 & 0xff] != (FILE *)0x0)) {
      acStack_70[0] = -0x66;
      acStack_70[1] = -0x51;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      fclose((FILE *)filePointers[uVar20 & 0xff]);
      return poVar13;
    }
    break;
  case 0x68:
    uVar20 = args[1].header >> 1;
    if (((uint)uVar20 < 200) && (filePointers[uVar20 & 0xff] != (FILE *)0x0)) {
      acStack_70[0] = '-';
      acStack_70[1] = -0x51;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      fileOut(filePointers[uVar20 & 0xff]);
      return poVar13;
    }
    break;
  case 0x69:
    acStack_70[0] = 'Y';
    acStack_70[1] = -0x50;
    acStack_70[2] = '\x10';
    acStack_70[3] = '\0';
    acStack_70[4] = '\0';
    acStack_70[5] = '\0';
    acStack_70[6] = '\0';
    acStack_70[7] = '\0';
    iVar6 = snprintf((char *)0x0,0,"%s/lsteditXXXXXX",tmpdir);
    lVar21 = (long)iVar6;
    acStack_70[0] = '~';
    acStack_70[1] = -0x50;
    acStack_70[2] = '\x10';
    acStack_70[3] = '\0';
    acStack_70[4] = '\0';
    acStack_70[5] = '\0';
    acStack_70[6] = '\0';
    acStack_70[7] = '\0';
    info_impl("primitive",0x9d,"temporary file name size is %d",(ulong)(iVar6 + 1));
    lVar19 = -(lVar21 + 0x11U & 0xfffffffffffffff0);
    pcVar23 = local_68 + lVar19;
    pcVar25 = acStack_70 + lVar19;
    pcVar25[0] = -0x5e;
    pcVar25[1] = -0x50;
    pcVar25[2] = '\x10';
    pcVar25[3] = '\0';
    pcVar25[4] = '\0';
    pcVar25[5] = '\0';
    pcVar25[6] = '\0';
    pcVar25[7] = '\0';
    memset(pcVar23,0,lVar21 + 2U);
    pcVar26 = acStack_70 + lVar19;
    pcVar26[0] = -0x43;
    pcVar26[1] = -0x50;
    pcVar26[2] = '\x10';
    pcVar26[3] = '\0';
    pcVar26[4] = '\0';
    pcVar26[5] = '\0';
    pcVar26[6] = '\0';
    pcVar26[7] = '\0';
    snprintf(pcVar23,lVar21 + 2U,"%s/lsteditXXXXXX",tmpdir);
    pcVar27 = acStack_70 + lVar19;
    builtin_strncpy(acStack_70 + lVar19,"ְ\x10",4);
    pcVar27[4] = '\0';
    pcVar27[5] = '\0';
    pcVar27[6] = '\0';
    pcVar27[7] = '\0';
    info_impl("primitive",0xa4,"DEBUG: temp file name pattern: %s",pcVar23);
    pcVar28 = acStack_70 + lVar19;
    builtin_strncpy(acStack_70 + lVar19,"ް\x10",4);
    pcVar28[4] = '\0';
    pcVar28[5] = '\0';
    pcVar28[6] = '\0';
    pcVar28[7] = '\0';
    iVar6 = mkstemp(pcVar23);
    if (iVar6 == -1) {
      pcVar29 = acStack_70 + lVar19;
      pcVar29[0] = -0x18;
      pcVar29[1] = -0x50;
      pcVar29[2] = '\x10';
      pcVar29[3] = '\0';
      pcVar29[4] = '\0';
      pcVar29[5] = '\0';
      pcVar29[6] = '\0';
      pcVar29[7] = '\0';
      puVar10 = (uint *)__errno_location();
      uVar5 = *puVar10;
      pcVar30 = acStack_70 + lVar19;
      pcVar30[0] = '\x04';
      pcVar30[1] = -0x4f;
      pcVar30[2] = '\x10';
      pcVar30[3] = '\0';
      pcVar30[4] = '\0';
      pcVar30[5] = '\0';
      pcVar30[6] = '\0';
      pcVar30[7] = '\0';
      error_impl("primitive",0xa9,"error making temporary file name: errno=%d!",(ulong)uVar5);
    }
    pcVar31 = acStack_70 + lVar19;
    pcVar31[0] = '\x13';
    pcVar31[1] = -0x4f;
    pcVar31[2] = '\x10';
    pcVar31[3] = '\0';
    pcVar31[4] = '\0';
    pcVar31[5] = '\0';
    pcVar31[6] = '\0';
    pcVar31[7] = '\0';
    pFVar11 = fopen(pcVar23,"w");
    if (pFVar11 == (FILE *)0x0) {
      pcVar32 = acStack_70 + lVar19;
      pcVar32[0] = '8';
      pcVar32[1] = -0x4f;
      pcVar32[2] = '\x10';
      pcVar32[3] = '\0';
      pcVar32[4] = '\0';
      pcVar32[5] = '\0';
      pcVar32[6] = '\0';
      pcVar32[7] = '\0';
      error_impl("primitive",0xae,"cannot open temp edit file %s!",pcVar23);
    }
    puVar10 = (uint *)args[1].header;
    uVar5 = *puVar10;
    unique0x10001d00 = args;
    if (3 < uVar5) {
      lVar39 = 0;
      do {
        bVar1 = *(byte *)((long)puVar10 + lVar39 + 0x10);
        pcVar33 = acStack_70 + lVar19;
        pcVar33[0] = 'c';
        pcVar33[1] = -0x4f;
        pcVar33[2] = '\x10';
        pcVar33[3] = '\0';
        pcVar33[4] = '\0';
        pcVar33[5] = '\0';
        pcVar33[6] = '\0';
        pcVar33[7] = '\0';
        fputc((uint)bVar1,pFVar11);
        lVar39 = lVar39 + 1;
      } while (uVar5 >> 2 != (uint)lVar39);
    }
    pcVar34 = acStack_70 + lVar19;
    pcVar34[0] = 'x';
    pcVar34[1] = -0x4f;
    pcVar34[2] = '\x10';
    pcVar34[3] = '\0';
    pcVar34[4] = '\0';
    pcVar34[5] = '\0';
    pcVar34[6] = '\0';
    pcVar34[7] = '\0';
    fputc(10,pFVar11);
    pcVar35 = acStack_70 + lVar19;
    pcVar35[0] = -0x80;
    pcVar35[1] = -0x4f;
    pcVar35[2] = '\x10';
    pcVar35[3] = '\0';
    pcVar35[4] = '\0';
    pcVar35[5] = '\0';
    pcVar35[6] = '\0';
    pcVar35[7] = '\0';
    fclose(pFVar11);
    uVar20 = lVar21 + 0x14U & 0xfffffffffffffff0;
    lVar39 = -uVar20;
    pcVar24 = pcVar23 + lVar39;
    pcVar24[-8] = -0x5a;
    pcVar24[-7] = -0x4f;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    memset(pcVar24,0,lVar21 + 5);
    builtin_strncpy(local_68 + (lVar19 - uVar20),"vi ",4);
    pcVar24[-8] = -0x43;
    pcVar24[-7] = -0x4f;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    strcat(pcVar24,pcVar23);
    builtin_strncpy(local_68 + lVar39 + lVar19 + -8,"ű\x10",4);
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    iVar6 = system(pcVar24);
    if (iVar6 == -1) {
      builtin_strncpy(local_68 + lVar39 + lVar19 + -8,"ϱ\x10",4);
      pcVar24[-4] = '\0';
      pcVar24[-3] = '\0';
      pcVar24[-2] = '\0';
      pcVar24[-1] = '\0';
      puVar10 = (uint *)__errno_location();
      uVar5 = *puVar10;
      pcVar24[-8] = -0x15;
      pcVar24[-7] = -0x4f;
      pcVar24[-6] = '\x10';
      pcVar24[-5] = '\0';
      pcVar24[-4] = '\0';
      pcVar24[-3] = '\0';
      pcVar24[-2] = '\0';
      pcVar24[-1] = '\0';
      error_impl("primitive",0xc5,"error starting editor: %d!",(ulong)uVar5);
    }
    pcVar24[-8] = -6;
    pcVar24[-7] = -0x4f;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    pFVar11 = fopen(pcVar23,"r");
    poVar13 = stack0xffffffffffffffc0;
    if (pFVar11 == (FILE *)0x0) {
      pcVar24[-8] = '#';
      pcVar24[-7] = -0x4e;
      pcVar24[-6] = '\x10';
      pcVar24[-5] = '\0';
      pcVar24[-4] = '\0';
      pcVar24[-3] = '\0';
      pcVar24[-2] = '\0';
      pcVar24[-1] = '\0';
      error_impl("primitive",0xcb,"cannot open temp edit file %s!",pcVar23);
    }
    pcVar24[-8] = '2';
    pcVar24[-7] = -0x4e;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    fseek(pFVar11,0,2);
    pcVar24[-8] = ':';
    pcVar24[-7] = -0x4e;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    lVar19 = ftell(pFVar11);
    uVar5 = (uint)lVar19;
    pcVar24[-8] = 'E';
    pcVar24[-7] = -0x4e;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    poVar12 = gcialloc(uVar5);
    poVar12->class = *(object **)(poVar13[1].header + 8);
    pcVar24[-8] = '`';
    pcVar24[-7] = -0x4e;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    fseek(pFVar11,0,0);
    if (0 < (int)uVar5) {
      uVar20 = 0;
      do {
        pcVar24[-8] = 'v';
        pcVar24[-7] = -0x4e;
        pcVar24[-6] = '\x10';
        pcVar24[-5] = '\0';
        pcVar24[-4] = '\0';
        pcVar24[-3] = '\0';
        pcVar24[-2] = '\0';
        pcVar24[-1] = '\0';
        iVar6 = fgetc(pFVar11);
        *(char *)((long)&poVar12[1].header + uVar20) = (char)iVar6;
        uVar20 = uVar20 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar20);
    }
    pcVar24[-8] = -0x75;
    pcVar24[-7] = -0x4e;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    fclose(pFVar11);
    pcVar24[-8] = -0x6c;
    pcVar24[-7] = -0x4e;
    pcVar24[-6] = '\x10';
    pcVar24[-5] = '\0';
    pcVar24[-4] = '\0';
    pcVar24[-3] = '\0';
    pcVar24[-2] = '\0';
    pcVar24[-1] = '\0';
    unlink(pcVar23);
    return poVar12;
  case 0x6a:
    uVar20 = args[1].header >> 1;
    if ((199 < (uint)uVar20) || ((FILE *)filePointers[uVar20 & 0xff] == (FILE *)0x0)) break;
    poVar13 = args[1].class;
    if (((poVar13->header & 2) == 0) ||
       (uVar5 = (uint)(args[2].header >> 1), ((uint)(poVar13->header >> 2) & 0x3fffffff) < uVar5))
    break;
    acStack_70[0] = -9;
    acStack_70[1] = -0x4e;
    acStack_70[2] = '\x10';
    acStack_70[3] = '\0';
    acStack_70[4] = '\0';
    acStack_70[5] = '\0';
    acStack_70[6] = '\0';
    acStack_70[7] = '\0';
    sVar14 = fread(poVar13 + 1,1,(ulong)(uVar5 & 0x7fffffff),(FILE *)filePointers[uVar20 & 0xff]);
    iVar6 = (int)sVar14;
    goto LAB_0010b2f7;
  case 0x6b:
    uVar20 = args[1].header >> 1;
    if ((199 < (uint)uVar20) || ((FILE *)filePointers[uVar20 & 0xff] == (FILE *)0x0)) break;
    poVar13 = args[1].class;
    if (((poVar13->header & 2) == 0) ||
       (uVar5 = (uint)(args[2].header >> 1), ((uint)(poVar13->header >> 2) & 0x3fffffff) < uVar5))
    break;
    acStack_70[0] = -3;
    acStack_70[1] = -0x51;
    acStack_70[2] = '\x10';
    acStack_70[3] = '\0';
    acStack_70[4] = '\0';
    acStack_70[5] = '\0';
    acStack_70[6] = '\0';
    acStack_70[7] = '\0';
    sVar14 = fwrite(poVar13 + 1,1,(ulong)(uVar5 & 0x7fffffff),(FILE *)filePointers[uVar20 & 0xff]);
    iVar6 = (int)sVar14;
LAB_0010b2f7:
    if (-1 < iVar6) {
      return (object *)((ulong)(uint)(iVar6 * 2) + 1);
    }
    break;
  case 0x6c:
    uVar20 = args[1].header >> 1;
    if ((((uint)uVar20 < 200) && ((FILE *)filePointers[uVar20 & 0xff] != (FILE *)0x0)) &&
       (((ulong)args[1].class >> 0x20 & 1) == 0)) {
      acStack_70[0] = 'I';
      acStack_70[1] = -0x4d;
      acStack_70[2] = '\x10';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      iVar6 = fseek((FILE *)filePointers[uVar20 & 0xff],(ulong)args[1].class >> 1 & 0x7fffffff,0);
      if (-1 < iVar6) {
        return (object *)(ulong)(iVar6 * 2 + 1);
      }
    }
    break;
  default:
    goto switchD_0010a9d0_default;
  }
LAB_0010b3b8:
  *failed = 1;
  return poVar13;
}

Assistant:

struct object *primitive(int primitiveNumber, struct object *args, int *failed)
{
    struct object *returnedValue = nilObject;
    int i, j;
    int rc;
    FILE *fp;
    uint8_t *p;
    struct byteObject *stringReturn;
    //char nameBuffer[80], modeBuffer[80];
    int subPrim=0;
    char netBuffer[18];
    struct sockaddr myAddr;
    struct sockaddr_in sin;
    struct in_addr iaddr;
    socklen_t myAddrSize;
    int sock;
    int sock_opt;
    int port;
    struct byteObject *ba;


    *failed = 0;
    switch(primitiveNumber) {
    case 100:
    {
        /* open a file */
        int pathSize = SIZE(args->data[0]) + 1;
        char *pathBuffer = (char *)alloca((size_t)pathSize);
        int modeSize = SIZE(args->data[1]) + 1;
        char *modeBuffer = (char *)alloca((size_t)modeSize);

        getUnixString(pathBuffer, pathSize, args->data[0]);
        getUnixString(modeBuffer, modeSize, args->data[1]);

        fp = fopen(pathBuffer, modeBuffer);
        if (fp != NULL) {
            for (i = 0; i < FILEMAX; ++i) {
                if (filePointers[i] == NULL) {
                    break;
                }
            }
            if (i >= FILEMAX) {
                error("too many open files");
            } else {
                returnedValue = newInteger(i);
                filePointers[i] = fp;
            }
        } else {
            *failed = 1;
        }
    }

    break;

    case 101:	/* read a single character from a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        i = fgetc(fp);
        if (i != EOF) {
            returnedValue = newInteger(i);
        }
        break;

    case 102:	/* write a single character to a file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fputc(integerValue(args->data[1]), fp);
        break;

    case 103:	/* close file */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fclose(fp);
        break;

    case 104:	/* file out image */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }
        fileOut(fp);
        break;

    case 105:
    {
        /* edit a string */
        char *tmpFileName = NULL;
        size_t tmpFileNameSize = 0;

        /* first get the size needed for the temporary path */
        tmpFileNameSize = (size_t)snprintf(tmpFileName, 0, "%s/lsteditXXXXXX", tmpdir) + 1;

        info("temporary file name size is %d", (int)tmpFileNameSize);

        /* allocate it on the stack and write the string into it. */
        tmpFileName = (char *)alloca((size_t)tmpFileNameSize + 1);
        memset(tmpFileName, 0, tmpFileNameSize + 1);
        snprintf(tmpFileName, tmpFileNameSize + 1, "%s/lsteditXXXXXX", tmpdir);

        info("DEBUG: temp file name pattern: %s",tmpFileName);

        rc = mkstemp(tmpFileName);
        /* copy string to file */
        if(rc == -1) {
            error("error making temporary file name: errno=%d!", errno);
        }

        fp = fopen(tmpFileName, "w");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        j = SIZE(args->data[0]);
        p = ((struct byteObject *) args->data[0])->bytes;

        for (i = 0; i < j; i++) {
            fputc(*p++, fp);
        }
        fputc('\n', fp);

        fclose(fp);

        /* call the editor */
        size_t cmdBufSize = tmpFileNameSize + strlen("vi ");
        char *cmdBuf = (char*)alloca(cmdBufSize + 1);
        memset(cmdBuf, 0, cmdBufSize + 1);

        strcpy(cmdBuf,"vi ");
        strcat(cmdBuf, tmpFileName);
        rc = system(cmdBuf);

        if(rc == -1) {
            error("error starting editor: %d!",(int)errno);
        }

        /* copy back to new string */
        fp = fopen(tmpFileName, "r");
        if (fp == NULL) {
            error("cannot open temp edit file %s!", tmpFileName);
        }

        /* get length of file */
        fseek(fp, 0, 2);
        j = (int) ftell(fp);

        returnedValue = (struct object *)(stringReturn = (struct byteObject *)gcialloc(j));
        returnedValue->class = args->data[0]->class;

        /* reset to beginning, and read values */
        fseek(fp, 0, 0);

        /* FIXME - check for EOF! */
        for (i = 0; i < j; i++) {
            stringReturn->bytes[i] = (uint8_t)fgetc(fp);
        }
        /* now clean up files */
        fclose(fp);
        unlink(tmpFileName);
    }

    break;

    case 106:	/* Read into ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're populating an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fread(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 107:	/* Write from ByteArray */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* Make sure we're writing an array of bytes */
        returnedValue = args->data[1];
        if (!IS_BINOBJ(returnedValue)) {
            *failed = 1;
            break;
        }

        /* Sanity check on I/O count */
        i = integerValue(args->data[2]);
        if ((i < 0) || (i > (int)SIZE(returnedValue))) {
            *failed = 1;
            break;
        }

        /* Do the I/O */
        i = (int)fwrite(bytePtr(returnedValue), sizeof(char), (size_t)i, fp);
        if (i < 0) {
            *failed = 1;
            break;
        }
        returnedValue = newInteger(i);
        break;

    case 108:	/* Seek to file position */
        /* File descriptor */
        i = integerValue(args->data[0]);
        if ((i < 0) || (i >= FILEMAX) || !(fp = filePointers[i])) {
            *failed = 1;
            break;
        }

        /* File position */
        i = integerValue(args->data[1]);
        if ((i < 0) || ((i = fseek(fp, i, SEEK_SET)) < 0)) {
            *failed = 1;
            break;
        }

        /* Return position as our value */
        returnedValue = newInteger(i);
        break;


    case 150:	/* match substring in a string. Return index of substring or fail. */
        /* make sure we've got strings */
        if(!IS_BINOBJ(args->data[0])) {
            printf("#position: failed, first arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        if(!IS_BINOBJ(args->data[1])) {
            printf("#position: failed, second arg is not a binary object.\n");
            *failed = 1;
            break;
        }

        /* get the sizes of the strings */
        i = SIZE(args->data[0]);
        j = SIZE(args->data[1]);

        /*
         * don't bother to compare if either string has a zero length
         * or the second string is longer than the first
         */

        if((i > 0) && (j > 0) && (i>=j)) {
            /* using alloca to make sure that the memory is freed automatically */
            char *p = (char *)alloca((size_t)i+1);
            char *q = (char *)alloca((size_t)j+1);
            char *r = (char *)0;

            getUnixString(p,i+1,args->data[0]);
            getUnixString(q,j+1,args->data[1]);

            /* find the pointer to the substring */
            r = strstr(p,q);

            if(r != NULL) {
                /* the string was found */
                returnedValue = newInteger((r-p)+1);
            } else {
                returnedValue = nilObject;
            }

            /* success */
            break;
        } else {
            if((i<0) || (j<0)) {
                printf("#position: failed due to unusable string sizes, string 1 size %d, string 2 size %d.\n", i, j);
            } else {
                /* i==0 or j==0 or i<j in which case we have no match but no error. */
                returnedValue = nilObject;
                break;
            }
        }

        /* if we get here, we've failed */
        *failed = 1;
        break;

    case 151: /* convert a string to URL encoding, returns nil or string */
        returnedValue = stringToUrl((struct byteObject *)args->data[0]);

        break;


    case 152: /* convert a string from URL encoding, returns nil or string */
        returnedValue = urlToString((struct byteObject *)args->data[0]);

        break;

    /* large timestamps */
    case 160: /* print out a microsecond timestamp and message string. */
        {
            struct byteObject *msg = (struct byteObject *)(args->data[0]);

            printf("Log: %.*s\n", SIZE(msg), bytePtr(msg));

            *failed = 0;

            returnedValue = nilObject;
        }

        break;

    case 161: /* return an Integer with the microsecond timestamp. */
        returnedValue = newLInteger(time_usec());
        *failed = 0;
        break;

    case 170: /* get argv strings as an Array of Strings. */
        {
            struct object *argv_array = NULL;

            /* allocate enough space for the result Array. */
            argv_array = gcalloc(prog_argc);
            argv_array->class = ArrayClass;

            /* we are going to allocate Strings and that could cause GC. */
            PUSH_ROOT(argv_array);

            for(int index = 0; index < prog_argc; index++) {
                struct object *argv_entry = NULL;
                const char *argv_str = prog_argv[index];
                int str_len = (int)strlen(argv_str);

                /* could cause GC */
                argv_entry = gcialloc(str_len);
                argv_entry->class = StringClass;

                /* copy the bytes. */
                for(int i=0; i < str_len; i++) {
                    bytePtr(argv_entry)[i] = (uint8_t)argv_str[i];
                }

                /* get the pointer to the array again.   Could have changed due to GC. */
                argv_array = PEEK_ROOT();

                argv_array->data[index] = argv_entry;
            }

            argv_array = POP_ROOT();

            returnedValue = argv_array;

            *failed = 0;
        }

        break;

    case 200: /* this is a set of primitives for socket handling */
        subPrim = integerValue(args->data[0]);

        /* 200-250 socket handling */
        switch(subPrim) {
        case 0: /* open a TCP socket */
            sock = socket(PF_INET,SOCK_STREAM,0);

            if(sock == -1) {
                error("Cannot open TCP socket.");
            }

            sock_opt = 1;

            if(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&sock_opt, sizeof(sock_opt))) {
                close(sock);
                error("Error setting socket reuse option!");
            }

            /* return the value anyway */

            info("opened socket %d.", sock);

            returnedValue = newInteger(sock);

            break;

        case 1: /* accept on a socket */
            sock = integerValue(args->data[1]);

            if(listen(sock, 10) == -1) {
                error("Error listening on TCP socket.");
            }

            /* set the maximum size */
            myAddrSize = sizeof(myAddr);

            /* printf("accept(%d, %p, %d)\n", sock, &myAddr, myAddrSize); */

            sock = accept(sock, &myAddr, &myAddrSize);
            if(sock == -1) {
                error("Error accepting on TCP socket.  Errno=%d", errno);
            }

            returnedValue = newInteger(sock);

            break;

        case 2: /* close a socket */
            sock = integerValue(args->data[1]);

            info("closing socket %d.", sock);

            close(sock);

            returnedValue = trueObject;

            break;

        case 3: /* bind a socket to an address and port */
            /* this takes three arguments, the socket fd,
            the address (as a dotted-notation string) and
            the port as an integer */
            sock = integerValue(args->data[1]);
            getUnixString(netBuffer, sizeof(netBuffer)-1, args->data[2]);
            port = integerValue(args->data[3]);

            info("Socket: %d",sock);
            info("IP: %s",netBuffer);
            info("Port: %d",port);

            /* convert the string IP to a network representation */
            if(inet_aton((const char *)netBuffer,&iaddr) == 0) {
                error("Illegal address passed to bind primitive.");
            }

            /* build a sockaddr_in struct */
            sin.sin_family = AF_INET;
            sin.sin_port = htons((u_int16_t)port);
            /*			sin.sin_port = (u_int16_t)0;*/
            sin.sin_addr = iaddr;

            if(bind(sock,(struct sockaddr *)&sin,sizeof(sin)) == -1) {
                error("Cannot bind TCP socket to address.");
            }

            returnedValue = trueObject;

            break;

        case 7: /* read from a TCP socket.  This returns a byte array. */
            sock = integerValue(args->data[1]);

            for(i=0; i<SOCK_BUF_SIZE; i++) {
                socketReadBuffer[i]=(char)0;
            }

            i = (int)read(sock,(void *)socketReadBuffer,(size_t)SOCK_BUF_SIZE);
            if((i < 0) && (errno != EAGAIN) && (errno != EWOULDBLOCK)) {
                info("socket read returned an error: %d (%d)!", i, errno);
                *failed = 1;
                break;
            }

//            printf("Read: %s\n",socketReadBuffer);

            ba = (struct byteObject *)gcialloc(i);
            ba->class = ByteArrayClass;

            /* copy data into the new ByteArray */
            for(j=0; j<i; j++) {
                bytePtr(ba)[j] = socketReadBuffer[j];
            }

            returnedValue = (struct object *)ba;

            break;

        case 8: /* write to a socket, args: sock, data */
            sock = integerValue(args->data[1]);
            p = (uint8_t *)bytePtr(args->data[2]);
            i = SIZE(args->data[2]);

            /*printf("Writing: ");
            snprintf(socketReadBuffer,i,"%s",p);
            socketReadBuffer[i] = (char)0;
            printf("%s\n",socketReadBuffer);
            */

            j = (int)write(sock,(void *)p,(size_t)i);

            if(j>0)
                returnedValue = newInteger(j);
            else
                returnedValue = nilObject;

            break;

        default: /* unknown socket primitive */
            error("Unknown socket primitive operation: %d!",subPrim);
            break;
        }

        break;

    default:
        error("unknown primitive %d!", primitiveNumber);
    }
    return(returnedValue);
}